

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_32sto7u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_INT32 OVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  
  pbVar9 = pDst + 6;
  for (uVar6 = 0; uVar6 < (length & 0xfffffffffffffff8); uVar6 = uVar6 + 8) {
    uVar10 = pSrc[uVar6 + 1];
    uVar8 = pSrc[uVar6 + 2];
    uVar1 = pSrc[uVar6 + 3];
    uVar2 = pSrc[uVar6 + 4];
    uVar3 = pSrc[uVar6 + 5];
    uVar4 = pSrc[uVar6 + 6];
    OVar5 = pSrc[uVar6 + 7];
    pbVar9[-6] = (byte)(uVar10 >> 6) | (char)pSrc[uVar6] * '\x02';
    pbVar9[-5] = (byte)(uVar8 >> 5) | (byte)(uVar10 << 2);
    pbVar9[-4] = (byte)(uVar1 >> 4) | (byte)(uVar8 << 3);
    pbVar9[-3] = (byte)(uVar2 >> 3) | (byte)(uVar1 << 4);
    pbVar9[-2] = (byte)(uVar3 >> 2) | (byte)(uVar2 << 5);
    pbVar9[-1] = (byte)(uVar4 >> 1) | (byte)(uVar3 << 6);
    *pbVar9 = (byte)(uVar4 << 7) | (byte)OVar5;
    pbVar9 = pbVar9 + 7;
  }
  if ((length & 7) != 0) {
    uVar10 = pSrc[uVar6];
    uVar8 = (uint)(length & 7);
    if (uVar8 == 1) {
      pbVar9 = pbVar9 + -6;
      sVar7 = 1;
    }
    else {
      pbVar9[-6] = (byte)((uint)pSrc[uVar6 + 1] >> 6) | (char)uVar10 * '\x02';
      uVar10 = pSrc[uVar6 + 1] & 0x3f;
      if (uVar8 < 3) {
        pbVar9 = pbVar9 + -5;
        sVar7 = 2;
      }
      else {
        pbVar9[-5] = (byte)((uint)pSrc[uVar6 + 2] >> 5) | (byte)(uVar10 << 2);
        uVar10 = pSrc[uVar6 + 2] & 0x1f;
        if (uVar8 == 3) {
          pbVar9 = pbVar9 + -4;
          sVar7 = 3;
        }
        else {
          pbVar9[-4] = (byte)((uint)pSrc[uVar6 + 3] >> 4) | (byte)(uVar10 << 3);
          uVar10 = pSrc[uVar6 + 3] & 0xf;
          if (uVar8 < 5) {
            pbVar9 = pbVar9 + -3;
            sVar7 = 4;
          }
          else {
            pbVar9[-3] = (byte)((uint)pSrc[uVar6 + 4] >> 3) | (byte)(uVar10 << 4);
            uVar10 = pSrc[uVar6 + 4] & 7;
            if (uVar8 == 5) {
              pbVar9 = pbVar9 + -2;
              sVar7 = 5;
            }
            else {
              pbVar9[-2] = (byte)((uint)pSrc[uVar6 + 5] >> 2) | (byte)(uVar10 << 5);
              uVar10 = pSrc[uVar6 + 5] & 3;
              if (uVar8 == 7) {
                pbVar9[-1] = (byte)((uint)pSrc[uVar6 + 6] >> 1) | (byte)(uVar10 << 6);
                uVar10 = pSrc[uVar6 + 6] & 1;
                sVar7 = 7;
              }
              else {
                sVar7 = 6;
                pbVar9 = pbVar9 + -1;
              }
            }
          }
        }
      }
    }
    *pbVar9 = (byte)(uVar10 << sVar7);
  }
  return;
}

Assistant:

static void tif_32sto7u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 1) | (src1 >> 6));
        *pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 5));
        *pDst++ = (OPJ_BYTE)((src2 << 3) | (src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 3));
        *pDst++ = (OPJ_BYTE)((src4 << 5) | (src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 1));
        *pDst++ = (OPJ_BYTE)((src6 << 7) | (src7));
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS((OPJ_UINT32)pSrc[i + 0], 7)
        if (length > 1U) {
            PUTBITS((OPJ_UINT32)pSrc[i + 1], 7)
            if (length > 2U) {
                PUTBITS((OPJ_UINT32)pSrc[i + 2], 7)
                if (length > 3U) {
                    PUTBITS((OPJ_UINT32)pSrc[i + 3], 7)
                    if (length > 4U) {
                        PUTBITS((OPJ_UINT32)pSrc[i + 4], 7)
                        if (length > 5U) {
                            PUTBITS((OPJ_UINT32)pSrc[i + 5], 7)
                            if (length > 6U) {
                                PUTBITS((OPJ_UINT32)pSrc[i + 6], 7)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}